

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O0

int setup_sparse(archive_read_disk *a,archive_entry *entry,int *fd)

{
  mode_t mVar1;
  int iVar2;
  wchar_t wVar3;
  la_int64_t lVar4;
  char *pcVar5;
  __off_t _Var6;
  int *piVar7;
  bool bVar8;
  char *local_58;
  char *path;
  int check_fully_sparse;
  int exit_sts;
  off_t off_e;
  off_t off_s;
  off_t initial_off;
  int64_t size;
  int *fd_local;
  archive_entry *entry_local;
  archive_read_disk *a_local;
  
  path._4_4_ = 0;
  bVar8 = false;
  mVar1 = archive_entry_filetype(entry);
  if (((mVar1 != 0x8000) || (lVar4 = archive_entry_size(entry), lVar4 < 1)) ||
     (pcVar5 = archive_entry_hardlink(entry), pcVar5 != (char *)0x0)) {
    return 0;
  }
  if (*fd < 0) {
    local_58 = archive_read_disk_entry_setup_path(a,entry,fd);
  }
  else {
    local_58 = (char *)0x0;
  }
  if (*fd < 0) {
    if (local_58 == (char *)0x0) {
      return -0x19;
    }
    iVar2 = open(local_58,0x80800);
    *fd = iVar2;
    if (*fd < 0) {
      piVar7 = __errno_location();
      archive_set_error(&a->archive,*piVar7,"Can\'t open `%s\'",local_58);
      return -0x19;
    }
    __archive_ensure_cloexec_flag(*fd);
    off_s = 0;
  }
  else {
    off_s = lseek(*fd,0,1);
    if (off_s != 0) {
      lseek(*fd,0,0);
    }
  }
  _Var6 = lseek(*fd,0,4);
  if (_Var6 < 0) {
    a_local._4_4_ = setup_sparse_fiemap(a,entry,fd);
  }
  else {
    if (0 < _Var6) {
      lseek(*fd,0,0);
    }
    off_e = 0;
    lVar4 = archive_entry_size(entry);
    while (off_e < lVar4) {
      _Var6 = lseek(*fd,off_e,3);
      if (_Var6 == -1) {
        piVar7 = __errno_location();
        if (*piVar7 != 6) {
          piVar7 = __errno_location();
          archive_set_error(&a->archive,*piVar7,"lseek(SEEK_HOLE) failed");
          path._4_4_ = -0x19;
          goto LAB_00628f08;
        }
        wVar3 = archive_entry_sparse_count(entry);
        bVar8 = wVar3 == L'\0';
        break;
      }
      off_e = lseek(*fd,_Var6,4);
      if (off_e == -1) {
        piVar7 = __errno_location();
        if ((*piVar7 != 6) || (_Var6 = lseek(*fd,0,2), _Var6 == -1)) {
          piVar7 = __errno_location();
          archive_set_error(&a->archive,*piVar7,"lseek(SEEK_DATA) failed");
          path._4_4_ = -0x19;
          goto LAB_00628f08;
        }
        break;
      }
      if ((_Var6 == 0) && (off_e == lVar4)) break;
      archive_entry_sparse_add_entry(entry,_Var6,off_e - _Var6);
    }
    if (((bVar8) && (_Var6 = lseek(*fd,0,4), _Var6 == 0)) &&
       (_Var6 = lseek(*fd,0,2), _Var6 == lVar4)) {
      archive_entry_sparse_add_entry(entry,0,0);
    }
LAB_00628f08:
    lseek(*fd,off_s,0);
    a_local._4_4_ = path._4_4_;
  }
  return a_local._4_4_;
}

Assistant:

static int
setup_sparse(struct archive_read_disk *a,
    struct archive_entry *entry, int *fd)
{
	int64_t size;
	off_t initial_off;
	off_t off_s, off_e;
	int exit_sts = ARCHIVE_OK;
	int check_fully_sparse = 0;
	const char *path;

	if (archive_entry_filetype(entry) != AE_IFREG
	    || archive_entry_size(entry) <= 0
	    || archive_entry_hardlink(entry) != NULL)
		return (ARCHIVE_OK);

	/* Does filesystem support the reporting of hole ? */
	if (*fd < 0)
		path = archive_read_disk_entry_setup_path(a, entry, fd);
	else
		path = NULL;

	if (*fd >= 0) {
#ifdef _PC_MIN_HOLE_SIZE
		if (fpathconf(*fd, _PC_MIN_HOLE_SIZE) <= 0)
			return (ARCHIVE_OK);
#endif
		initial_off = lseek(*fd, 0, SEEK_CUR);
		if (initial_off != 0)
			lseek(*fd, 0, SEEK_SET);
	} else {
		if (path == NULL)
			return (ARCHIVE_FAILED);
#ifdef _PC_MIN_HOLE_SIZE
		if (pathconf(path, _PC_MIN_HOLE_SIZE) <= 0)
			return (ARCHIVE_OK);
#endif
		*fd = open(path, O_RDONLY | O_NONBLOCK | O_CLOEXEC);
		if (*fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Can't open `%s'", path);
			return (ARCHIVE_FAILED);
		}
		__archive_ensure_cloexec_flag(*fd);
		initial_off = 0;
	}

#ifndef _PC_MIN_HOLE_SIZE
	/* Check if the underlying filesystem supports seek hole */
	off_s = lseek(*fd, 0, SEEK_HOLE);
	if (off_s < 0)
#if defined(HAVE_LINUX_FIEMAP_H)
		return setup_sparse_fiemap(a, entry, fd);
#else
		goto exit_setup_sparse;
#endif
	else if (off_s > 0)
		lseek(*fd, 0, SEEK_SET);
#endif

	off_s = 0;
	size = archive_entry_size(entry);
	while (off_s < size) {
		off_s = lseek(*fd, off_s, SEEK_DATA);
		if (off_s == (off_t)-1) {
			if (errno == ENXIO) {
				/* no more hole */
				if (archive_entry_sparse_count(entry) == 0) {
					/* Potentially a fully-sparse file. */
					check_fully_sparse = 1;
				}
				break;
			}
			archive_set_error(&a->archive, errno,
			    "lseek(SEEK_HOLE) failed");
			exit_sts = ARCHIVE_FAILED;
			goto exit_setup_sparse;
		}
		off_e = lseek(*fd, off_s, SEEK_HOLE);
		if (off_e == (off_t)-1) {
			if (errno == ENXIO) {
				off_e = lseek(*fd, 0, SEEK_END);
				if (off_e != (off_t)-1)
					break;/* no more data */
			}
			archive_set_error(&a->archive, errno,
			    "lseek(SEEK_DATA) failed");
			exit_sts = ARCHIVE_FAILED;
			goto exit_setup_sparse;
		}
		if (off_s == 0 && off_e == size)
			break;/* This is not sparse. */
		archive_entry_sparse_add_entry(entry, off_s,
			off_e - off_s);
		off_s = off_e;
	}

	if (check_fully_sparse) {
		if (lseek(*fd, 0, SEEK_HOLE) == 0 &&
			lseek(*fd, 0, SEEK_END) == size) {
			/* Fully sparse file; insert a zero-length "data" entry */
			archive_entry_sparse_add_entry(entry, 0, 0);
		}
	}
exit_setup_sparse:
	lseek(*fd, initial_off, SEEK_SET);
	return (exit_sts);
}